

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprintdialog_unix.cpp
# Opt level: O3

bool __thiscall QUnixPrintWidgetPrivate::checkFields(QUnixPrintWidgetPrivate *this)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  QPrintDialog *pQVar4;
  long in_FS_OFFSET;
  QAnyStringView QVar5;
  QAnyStringView QVar6;
  QFileInfo fi;
  QArrayData *local_a8 [3];
  QArrayData *local_90 [3];
  QArrayData *local_78 [3];
  undefined8 local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  QString local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if ((*(byte *)(*(long *)((this->widget).super_Ui_QPrintWidget.filename + 0x20) + 8) & 1) == 0) {
    local_48.d.size = -0x5555555555555556;
    local_48.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
    local_48.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
    QLineEdit::text();
    local_58 = 0xaaaaaaaaaaaaaaaa;
    uStack_50 = 0xaaaaaaaaaaaaaaaa;
    QFile::QFile((QFile *)&local_58,&local_48);
    local_60 = 0xaaaaaaaaaaaaaaaa;
    QFileInfo::QFileInfo((QFileInfo *)&local_60,(QFileDevice *)&local_58);
    cVar1 = QFileInfo::exists();
    if (cVar1 == '\0') {
      cVar1 = QFile::open(&local_58,4);
      if (cVar1 == '\0') goto LAB_001447b9;
      QFileDevice::close();
      QFile::remove();
LAB_00144688:
      bVar2 = true;
    }
    else {
      cVar1 = QFileInfo::isDir();
      if (cVar1 == '\0') {
        cVar1 = QFileInfo::isWritable();
        if (cVar1 == '\0') {
LAB_001447b9:
          pQVar4 = this->q;
          QWidget::windowTitle();
          iVar3 = 0x1580aa;
          goto LAB_001447de;
        }
        cVar1 = QFile::open(&local_58,4);
        if (cVar1 == '\0') goto LAB_001447b9;
        pQVar4 = this->q;
        QWidget::windowTitle();
        QMetaObject::tr((char *)local_a8,(char *)&QPrintDialog::staticMetaObject,0x1580e8);
        QVar5.m_size = (size_t)local_a8;
        QVar5.field_0.m_data = local_90;
        QString::arg_impl(QVar5,(int)local_48.d.ptr,(QChar)(char16_t)local_48.d.size);
        iVar3 = QMessageBox::question(pQVar4,local_78,local_90,0x14000,0x10000);
        if (local_90[0] != (QArrayData *)0x0) {
          LOCK();
          (local_90[0]->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_90[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_90[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(local_90[0],2,0x10);
          }
        }
        if (local_a8[0] != (QArrayData *)0x0) {
          LOCK();
          (local_a8[0]->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_a8[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_a8[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(local_a8[0],2,0x10);
          }
        }
        if (local_78[0] != (QArrayData *)0x0) {
          LOCK();
          (local_78[0]->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_78[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_78[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(local_78[0],2,0x10);
          }
        }
        if (iVar3 != 0x10000) {
          QFileDevice::close();
          goto LAB_00144688;
        }
      }
      else {
        pQVar4 = this->q;
        QWidget::windowTitle();
        iVar3 = 0x158072;
LAB_001447de:
        QMetaObject::tr((char *)local_a8,(char *)&QPrintDialog::staticMetaObject,iVar3);
        QVar6.m_size = (size_t)local_a8;
        QVar6.field_0.m_data = local_90;
        QString::arg_impl(QVar6,(int)local_48.d.ptr,(QChar)(char16_t)local_48.d.size);
        QMessageBox::warning(pQVar4,local_78,local_90,0x400,0);
        if (local_90[0] != (QArrayData *)0x0) {
          LOCK();
          (local_90[0]->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_90[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_90[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(local_90[0],2,0x10);
          }
        }
        if (local_a8[0] != (QArrayData *)0x0) {
          LOCK();
          (local_a8[0]->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_a8[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_a8[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(local_a8[0],2,0x10);
          }
        }
        if (local_78[0] != (QArrayData *)0x0) {
          LOCK();
          (local_78[0]->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_78[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_78[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(local_78[0],2,0x10);
          }
        }
      }
      bVar2 = false;
    }
    QFileInfo::~QFileInfo((QFileInfo *)&local_60);
    QFile::~QFile((QFile *)&local_58);
    if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (!bVar2) {
      bVar2 = false;
      goto LAB_001448dd;
    }
  }
  bVar2 = true;
LAB_001448dd:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool QUnixPrintWidgetPrivate::checkFields()
{
    if (widget.filename->isEnabled()) {
        QString file = widget.filename->text();
        QFile f(file);
        QFileInfo fi(f);
        bool exists = fi.exists();
        bool opened = false;
        if (exists && fi.isDir()) {
            QMessageBox::warning(q, q->windowTitle(),
                            QPrintDialog::tr("%1 is a directory.\nPlease choose a different file name.").arg(file));
            return false;
        } else if ((exists && !fi.isWritable()) || !(opened = f.open(QFile::Append))) {
            QMessageBox::warning(q, q->windowTitle(),
                            QPrintDialog::tr("File %1 is not writable.\nPlease choose a different file name.").arg(file));
            return false;
        } else if (exists) {
            int ret = QMessageBox::question(q, q->windowTitle(),
                                            QPrintDialog::tr("%1 already exists.\nDo you want to overwrite it?").arg(file),
                                            QMessageBox::Yes|QMessageBox::No, QMessageBox::No);
            if (ret == QMessageBox::No)
                return false;
        }
        if (opened) {
            f.close();
            if (!exists)
                f.remove();
        }
    }

#if QT_CONFIG(cups)
    if (propertiesDialog) {
        QCUPSSupport::PagesPerSheet pagesPerSheet = qvariant_cast<QCUPSSupport::PagesPerSheet>(propertiesDialog->widget.pageSetup->m_ui.pagesPerSheetCombo
                                                                    ->currentData());

        QCUPSSupport::PageSet pageSet = qvariant_cast<QCUPSSupport::PageSet>(optionsPane->options.pageSetCombo->currentData());


        if (pagesPerSheet != QCUPSSupport::OnePagePerSheet
            && pageSet != QCUPSSupport::AllPages) {
            QMessageBox::warning(q, q->windowTitle(),
                                 QPrintDialog::tr("Options 'Pages Per Sheet' and 'Page Set' cannot be used together.\nPlease turn one of those options off."));
            return false;
        }
    }
#endif

    // Every test passed. Accept the dialog.
    return true;
}